

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *Result,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
            is_any_ofF<char> *Pred,token_compress_mode_type eCompress)

{
  ulong uVar1;
  undefined8 **ppuVar2;
  ulong __n;
  undefined8 ***pppuVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  undefined8 ***__src;
  undefined8 **local_80 [2];
  ulong local_70;
  anon_union_16_2_ba345be5_for_m_Storage local_68;
  ulong local_58;
  token_compress_mode_type local_50;
  undefined8 **local_48 [2];
  ulong local_38;
  
  uVar1 = Pred->m_Size;
  local_48[0] = (undefined8 ***)0x0;
  pppuVar3 = local_48;
  local_38 = uVar1;
  if (0x10 < uVar1) {
    local_48[0] = (undefined8 **)operator_new__(uVar1);
    Pred = (is_any_ofF<char> *)(Pred->m_Storage).m_dynSet;
    pppuVar3 = (undefined8 ***)local_48[0];
  }
  memcpy(pppuVar3,Pred,uVar1);
  uVar1 = local_38;
  local_70 = local_38;
  local_80[0] = (undefined8 ***)0x0;
  if (local_38 < 0x11) {
    pppuVar3 = local_80;
    __src = local_48;
  }
  else {
    pppuVar3 = (undefined8 ***)operator_new__(local_38);
    __src = (undefined8 ***)local_48[0];
    local_80[0] = pppuVar3;
  }
  memcpy(pppuVar3,__src,uVar1);
  __n = local_70;
  local_58 = local_70;
  local_68.m_dynSet = (set_value_type *)0x0;
  local_50 = eCompress;
  if (local_70 < 0x11) {
    memcpy(&local_68,local_80,local_70);
  }
  else {
    local_68.m_dynSet = (set_value_type *)operator_new__(local_70);
    ppuVar2 = local_80[0];
    memcpy(local_68.m_dynSet,local_80[0],__n);
    if ((undefined8 ***)ppuVar2 != (undefined8 ***)0x0) {
      operator_delete__(ppuVar2);
    }
  }
  pvVar4 = iter_split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
                     (Result,Input,
                      (token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)&local_68);
  if ((0x10 < local_58) && (local_68.m_dynSet != (set_value_type *)0x0)) {
    operator_delete__(local_68.m_dynSet);
  }
  if ((0x10 < uVar1) && ((undefined8 ***)local_48[0] != (undefined8 ***)0x0)) {
    operator_delete__(local_48[0]);
  }
  return pvVar4;
}

Assistant:

inline SequenceSequenceT& split(
            SequenceSequenceT& Result,
            RangeT& Input,
            PredicateT Pred,
            token_compress_mode_type eCompress=token_compress_off )
        {
            return ::boost::algorithm::iter_split(
                Result,
                Input,
                ::boost::algorithm::token_finder( Pred, eCompress ) );         
        }